

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

bool __thiscall
cs_impl::
cni_helper<bool_(*)(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_bool_(*)(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
::_call<0>(cni_helper<bool_(*)(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_bool_(*)(const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
           *this,vector *args,sequence<0> *param_2)

{
  bool bVar1;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *plVar2;
  
  plVar2 = try_convert_and_check<const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  if ((this->mFunc).super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar1 = (*(this->mFunc)._M_invoker)((_Any_data *)this,plVar2);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}